

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (pointer != (void *)0x0) {
    *(undefined ***)((long)pointer + 0x20) = &PTR_shouldAllow_004495f0;
    lVar1 = *(long *)((long)pointer + 0x48);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0x50);
      lVar3 = *(long *)((long)pointer + 0x58);
      *(undefined8 *)((long)pointer + 0x48) = 0;
      *(undefined8 *)((long)pointer + 0x50) = 0;
      *(undefined8 *)((long)pointer + 0x58) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x60))
                (*(undefined8 **)((long)pointer + 0x60),lVar1,0x18,
                 (lVar2 - lVar1 >> 3) * -0x5555555555555555,
                 (lVar3 - lVar1 >> 3) * -0x5555555555555555,0);
    }
    lVar1 = *(long *)((long)pointer + 0x28);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0x30);
      lVar3 = *(long *)((long)pointer + 0x38);
      *(undefined8 *)((long)pointer + 0x28) = 0;
      *(undefined8 *)((long)pointer + 0x30) = 0;
      *(undefined8 *)((long)pointer + 0x38) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x40))
                (*(undefined8 **)((long)pointer + 0x40),lVar1,0x18,
                 (lVar2 - lVar1 >> 3) * -0x5555555555555555,
                 (lVar3 - lVar1 >> 3) * -0x5555555555555555,0);
    }
  }
  operator_delete(pointer,0x78);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }